

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void el::Loggers::setDefaultConfigurations
               (Configurations *configurations,bool reconfigureExistingLoggers)

{
  element_type *this;
  RegisteredLoggers *this_00;
  bool reconfigureExistingLoggers_local;
  Configurations *configurations_local;
  
  this = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)el::base::elStorage);
  this_00 = el::base::Storage::registeredLoggers(this);
  el::base::RegisteredLoggers::setDefaultConfigurations(this_00,configurations);
  if (reconfigureExistingLoggers) {
    reconfigureAllLoggers(configurations);
  }
  return;
}

Assistant:

void Loggers::setDefaultConfigurations(const Configurations& configurations, bool reconfigureExistingLoggers) {
  ELPP->registeredLoggers()->setDefaultConfigurations(configurations);
  if (reconfigureExistingLoggers) {
    Loggers::reconfigureAllLoggers(configurations);
  }
}